

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equation-solver.cpp
# Opt level: O3

int msdfgen::solveCubicNormed(double *x,double a,double b,double c)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  dVar6 = a * a;
  auVar8._0_8_ = (dVar6 + dVar6 + b * -9.0) * a + c * 27.0;
  auVar8._8_8_ = b * -3.0 + dVar6;
  auVar8 = divpd(auVar8,_DAT_0019d5d0);
  dVar4 = auVar8._8_8_;
  dVar7 = auVar8._0_8_;
  dVar6 = dVar4 * dVar4 * dVar4;
  if (dVar6 <= dVar7 * dVar7) {
    dVar6 = dVar7 * dVar7 - dVar6;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar6 = pow(ABS(dVar7) + dVar6,0.3333333333333333);
    dVar7 = (double)(~-(ulong)(dVar7 < 0.0) & (ulong)-dVar6 | -(ulong)(dVar7 < 0.0) & (ulong)dVar6);
    dVar4 = (double)(~-(ulong)(-dVar6 == dVar6) & (ulong)(dVar4 / dVar7));
    dVar6 = dVar7 + dVar4;
    *x = dVar6 - a / 3.0;
    dVar4 = (dVar7 - dVar4) * 0.8660254037844386;
    x[1] = dVar6 * -0.5 - a / 3.0;
    x[2] = dVar4;
    iVar1 = 2;
    if (1e-14 <= ABS(dVar4)) {
      iVar1 = 1;
    }
  }
  else {
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar5 = -1.0;
    if (-1.0 <= dVar7 / dVar6) {
      dVar5 = dVar7 / dVar6;
    }
    uVar2 = 0;
    uVar3 = 0x3ff00000;
    if (dVar5 <= 1.0) {
      uVar2 = SUB84(dVar5,0);
      uVar3 = (undefined4)((ulong)dVar5 >> 0x20);
    }
    dVar6 = acos((double)CONCAT44(uVar3,uVar2));
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar4 = dVar4 * -2.0;
    dVar7 = cos(dVar6 / 3.0);
    dVar5 = a / -3.0;
    *x = dVar7 * dVar4 + dVar5;
    dVar7 = cos((dVar6 + 6.283185307179586) / 3.0);
    x[1] = dVar7 * dVar4 + dVar5;
    dVar6 = cos((dVar6 + -6.283185307179586) / 3.0);
    x[2] = dVar6 * dVar4 + dVar5;
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int solveCubicNormed(double *x, double a, double b, double c) {
    double a2 = a*a;
    double q  = (a2 - 3*b)/9; 
    double r  = (a*(2*a2-9*b) + 27*c)/54;
    double r2 = r*r;
    double q3 = q*q*q;
    double A, B;
    if (r2 < q3) {
        double t = r/sqrt(q3);
        if (t < -1) t = -1;
        if (t > 1) t = 1;
        t = acos(t);
        a /= 3; q = -2*sqrt(q);
        x[0] = q*cos(t/3)-a;
        x[1] = q*cos((t+2*M_PI)/3)-a;
        x[2] = q*cos((t-2*M_PI)/3)-a;
        return 3;
    } else {
        A = -pow(fabs(r)+sqrt(r2-q3), 1/3.); 
        if (r < 0) A = -A;
        B = A == 0 ? 0 : q/A;
        a /= 3;
        x[0] = (A+B)-a;
        x[1] = -0.5*(A+B)-a;
        x[2] = 0.5*sqrt(3.)*(A-B);
        if (fabs(x[2]) < 1e-14)
            return 2;
        return 1;
    }
}